

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

void __thiscall ev3dev::led::off(led *this)

{
  int in_stack_00000024;
  led *in_stack_00000028;
  
  set_brightness(in_stack_00000028,in_stack_00000024);
  ~led((led *)0x132594);
  return;
}

Assistant:

void off() { set_brightness(0); }